

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode parse_port(Curl_URL *u,char *hostname)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  CURLUcode CVar4;
  char *pcVar5;
  char endbracket;
  int len;
  char *rest;
  char portbuf [7];
  char local_3d;
  int local_3c;
  char *local_38;
  char local_2f [7];
  
  iVar2 = __isoc99_sscanf(hostname,"[%*45[0123456789abcdefABCDEF:.%%]%c%n",&local_3d,&local_3c);
  if ((iVar2 == 1) && (local_3d == ']')) {
    if (hostname[local_3c] != ':') {
      return CURLUE_MALFORMED_INPUT;
    }
    pcVar5 = hostname + local_3c;
  }
  else {
    pcVar5 = strchr(hostname,0x3a);
  }
  if (pcVar5 == (char *)0x0) {
    return CURLUE_OK;
  }
  iVar2 = Curl_isdigit((uint)(byte)pcVar5[1]);
  CVar4 = CURLUE_BAD_PORT_NUMBER;
  if (iVar2 != 0) {
    lVar3 = strtol(pcVar5 + 1,&local_38,10);
    if ((0xffffffffffff0000 < lVar3 - 0x10000U) && (*local_38 == '\0')) {
      *pcVar5 = '\0';
      if (local_38 != pcVar5 + 1) {
        *local_38 = '\0';
        bVar1 = false;
        curl_msnprintf(local_2f,7,"%ld",lVar3);
        u->portnum = lVar3;
        pcVar5 = (*Curl_cstrdup)(local_2f);
        u->port = pcVar5;
        if (pcVar5 == (char *)0x0) {
          CVar4 = CURLUE_OUT_OF_MEMORY;
          goto LAB_0044f536;
        }
      }
      bVar1 = true;
      goto LAB_0044f536;
    }
  }
  bVar1 = false;
LAB_0044f536:
  if (bVar1) {
    return CURLUE_OK;
  }
  return CVar4;
}

Assistant:

static CURLUcode parse_port(struct Curl_URL *u, char *hostname)
{
  char *portptr;
  char endbracket;
  int len;

  if((1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.%%]%c%n",
                  &endbracket, &len)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    portptr = &hostname[len];
    if (*portptr != ':')
      return CURLUE_MALFORMED_INPUT;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];

    if(!ISDIGIT(portptr[1]))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port <= 0) || (port > 0xffff))
      /* Single unix standard says port numbers are 16 bits long, but we don't
         treat port zero as OK. */
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    if(rest != &portptr[1]) {
      *portptr++ = '\0'; /* cut off the name there */
      *rest = 0;
      /* generate a new to get rid of leading zeroes etc */
      snprintf(portbuf, sizeof(portbuf), "%ld", port);
      u->portnum = port;
      u->port = strdup(portbuf);
      if(!u->port)
        return CURLUE_OUT_OF_MEMORY;
    }
    else {
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
    }
  }

  return CURLUE_OK;
}